

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

void pzshape::TPZShapePiram::SideShape
               (int side,TPZVec<double> *point,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  
  if (0x12 < (uint)side) {
    std::operator<<((ostream *)&std::cerr,"TPZCompElPi3d::SideShapeFunction. Bad paramenter side.\n"
                   );
    return;
  }
  if (side == 0x12) {
    Shape(point,id,order,phi,dphi);
    return;
  }
  if ((uint)side < 5) {
    pdVar1 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar1 = 1.0;
    return;
  }
  if ((uint)side < 0xd) {
    TPZShapeLinear::Shape(point,id,order,phi,dphi);
    return;
  }
  if (side == 0xd) {
    TPZShapeQuad::Shape(point,id,order,phi,dphi);
    return;
  }
  TPZShapeTriang::Shape(point,id,order,phi,dphi);
  return;
}

Assistant:

void TPZShapePiram::SideShape(int side, TPZVec<REAL> &point, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		if(side<0 || side>18) PZError << "TPZCompElPi3d::SideShapeFunction. Bad paramenter side.\n";
		else if(side==18) Shape(point,id,order,phi,dphi);
		else if(side<5) TPZShapePoint::Shape(point,id,order,phi,dphi);
		else if(side<13) {//5 a 12
			TPZShapeLinear::Shape(point,id,order,phi,dphi);
		} else if(side == 13) {
			TPZShapeQuad::Shape(point,id,order,phi,dphi);
		} else if(side<18) {//faces 13  a 17
			TPZShapeTriang::Shape(point,id,order,phi,dphi);
		}
		
	}